

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlRegisterInputCallbacks
              (xmlInputMatchCallback matchFunc,xmlInputOpenCallback openFunc,
              xmlInputReadCallback readFunc,xmlInputCloseCallback closeFunc)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)xmlInputCallbackNr;
  iVar1 = -1;
  if (lVar2 < 0xf) {
    xmlInputCallbackTable[lVar2].matchcallback = matchFunc;
    xmlInputCallbackTable[lVar2].opencallback = openFunc;
    xmlInputCallbackTable[lVar2].readcallback = readFunc;
    xmlInputCallbackTable[lVar2].closecallback = closeFunc;
    xmlInputCallbackInitialized = 1;
    iVar1 = xmlInputCallbackNr;
    xmlInputCallbackNr = xmlInputCallbackNr + 1;
  }
  return iVar1;
}

Assistant:

int
xmlRegisterInputCallbacks(xmlInputMatchCallback matchFunc,
	xmlInputOpenCallback openFunc, xmlInputReadCallback readFunc,
	xmlInputCloseCallback closeFunc) {
    if (xmlInputCallbackNr >= MAX_INPUT_CALLBACK) {
	return(-1);
    }
    xmlInputCallbackTable[xmlInputCallbackNr].matchcallback = matchFunc;
    xmlInputCallbackTable[xmlInputCallbackNr].opencallback = openFunc;
    xmlInputCallbackTable[xmlInputCallbackNr].readcallback = readFunc;
    xmlInputCallbackTable[xmlInputCallbackNr].closecallback = closeFunc;
    xmlInputCallbackInitialized = 1;
    return(xmlInputCallbackNr++);
}